

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::GenericOutputFile::writeMagicNumberAndVersionField
          (GenericOutputFile *this,OStream *os,Header *headers,int parts)

{
  __type_conflict _Var1;
  bool bVar2;
  int in_ECX;
  Header *in_RDI;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  int version;
  int in_stack_ffffffffffffffdc;
  int v;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>
            ((OStream *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  uVar3 = 2;
  if (in_ECX == 1) {
    Header::type_abi_cxx11_((Header *)0x95f6ff);
    _Var1 = std::operator==(unaff_retaddr,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI);
    if (_Var1) {
      uVar3 = uVar3 | 0x200;
    }
  }
  else {
    uVar3 = 0x1002;
  }
  for (v = 0; v < in_ECX; v = v + 1) {
    bVar2 = usesLongNames(in_RDI);
    if (bVar2) {
      uVar3 = uVar3 | 0x400;
    }
    bVar2 = Header::hasType((Header *)0x95f785);
    if (bVar2) {
      Header::type_abi_cxx11_((Header *)0x95f7a1);
      bVar2 = isImage((string *)CONCAT44(in_ECX,uVar3));
      if (!bVar2) {
        uVar3 = uVar3 | 0x800;
      }
    }
  }
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>((OStream *)CONCAT44(in_ECX,uVar3),v);
  return;
}

Assistant:

void
GenericOutputFile::writeMagicNumberAndVersionField (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header*                            headers,
    int                                      parts)
{
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, MAGIC);

    int version = EXR_VERSION;

    if (parts == 1)
    {
        if (headers[0].type () == TILEDIMAGE) version |= TILED_FLAG;
    }
    else { version |= MULTI_PART_FILE_FLAG; }

    for (int i = 0; i < parts; i++)
    {
        if (usesLongNames (headers[i])) version |= LONG_NAMES_FLAG;

        if (headers[i].hasType () && isImage (headers[i].type ()) == false)
            version |= NON_IMAGE_FLAG;
    }

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, version);
}